

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiredis.c
# Opt level: O2

int redisFormatCommandArgv(char **target,int argc,char **argv,size_t *argvlen)

{
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  char *__s;
  int iVar6;
  ulong uVar7;
  
  iVar2 = -1;
  if (target != (char **)0x0) {
    uVar1 = countDigits((long)argc);
    iVar6 = uVar1 + 3;
    uVar7 = 0;
    uVar4 = 0;
    if (0 < argc) {
      uVar4 = (ulong)(uint)argc;
    }
    for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      if (argvlen == (size_t *)0x0) {
        sVar5 = strlen(argv[uVar7]);
      }
      else {
        sVar5 = argvlen[uVar7];
      }
      sVar5 = bulklen(sVar5);
      iVar6 = iVar6 + (int)sVar5;
    }
    __s = (char *)malloc((long)(iVar6 + 1));
    if (__s != (char *)0x0) {
      iVar2 = sprintf(__s,"*%d\r\n",(ulong)(uint)argc);
      for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
        if (argvlen == (size_t *)0x0) {
          sVar5 = strlen(argv[uVar7]);
        }
        else {
          sVar5 = argvlen[uVar7];
        }
        iVar3 = sprintf(__s + iVar2,"$%zu\r\n",sVar5);
        iVar3 = iVar3 + iVar2;
        memcpy(__s + iVar3,argv[uVar7],sVar5);
        (__s + ((int)sVar5 + iVar3))[0] = '\r';
        (__s + ((int)sVar5 + iVar3))[1] = '\n';
        iVar2 = iVar3 + (int)sVar5 + 2;
      }
      if (iVar2 != iVar6) {
        __assert_fail("pos == totlen",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/hiredis.c"
                      ,0x276,
                      "int redisFormatCommandArgv(char **, int, const char **, const size_t *)");
      }
      __s[iVar6] = '\0';
      *target = __s;
      iVar2 = iVar6;
    }
  }
  return iVar2;
}

Assistant:

int redisFormatCommandArgv(char **target, int argc, const char **argv, const size_t *argvlen) {
    char *cmd = NULL; /* final command */
    int pos; /* position in final command */
    size_t len;
    int totlen, j;

    /* Abort on a NULL target */
    if (target == NULL)
        return -1;

    /* Calculate number of bytes needed for the command */
    totlen = 1+countDigits(argc)+2;
    for (j = 0; j < argc; j++) {
        len = argvlen ? argvlen[j] : strlen(argv[j]);
        totlen += bulklen(len);
    }

    /* Build the command at protocol level */
    cmd = malloc(totlen+1);
    if (cmd == NULL)
        return -1;

    pos = sprintf(cmd,"*%d\r\n",argc);
    for (j = 0; j < argc; j++) {
        len = argvlen ? argvlen[j] : strlen(argv[j]);
        pos += sprintf(cmd+pos,"$%zu\r\n",len);
        memcpy(cmd+pos,argv[j],len);
        pos += len;
        cmd[pos++] = '\r';
        cmd[pos++] = '\n';
    }
    assert(pos == totlen);
    cmd[pos] = '\0';

    *target = cmd;
    return totlen;
}